

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCommunicationsNode.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::IOCommunicationsNode::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,IOCommunicationsNode *this)

{
  ostream *poVar1;
  KINT32 Value;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IOCommunicationsNode *local_18;
  IOCommunicationsNode *this_local;
  
  local_18 = this;
  this_local = (IOCommunicationsNode *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  StandardVariable::GetAsString_abi_cxx11_(&local_1c0,&this->super_StandardVariable);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"Node Type: ");
  ENUMS::GetEnumAsStringIOCommunicationsNodeType_abi_cxx11_
            (&local_1f0,(ENUMS *)(ulong)(byte)(this->super_StandardVariable).field_0xe,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\n");
  CommunicationsNodeID::GetAsString_abi_cxx11_(&local_210,&this->m_CommID);
  std::operator<<(poVar1,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IOCommunicationsNode::GetAsString() const
{
    KStringStream ss;

    ss << StandardVariable::GetAsString()
       << "Node Type: " << GetEnumAsStringIOCommunicationsNodeType( m_ui8CommNodeTyp ) << "\n"
       << m_CommID.GetAsString();

    return ss.str();
}